

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo>::
destroy(AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo> *this
       )

{
  AsyncPipe *pAVar1;
  
  pAVar1 = (this->adapter).pipe;
  if ((BlockedPumpTo *)(pAVar1->state).ptr == &this->adapter) {
    (pAVar1->state).ptr = (AsyncCapabilityStream *)0x0;
  }
  Canceler::~Canceler(&(this->adapter).canceler);
  AsyncIoStream::~AsyncIoStream((AsyncIoStream *)&this->adapter);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&this->result);
  AsyncObject::~AsyncObject((AsyncObject *)&this->super_PromiseFulfiller<unsigned_long>);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }